

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O3

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
DatabaseConfig::get_all_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,DatabaseConfig *this)

{
  ConfigKey *key;
  uint64_t local_48;
  vector<ConfigKey,_std::allocator<ConfigKey>_> local_40;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  ConfigKey::available();
  for (; local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
         super__Vector_impl_data._M_finish;
      local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    local_48 = get(this,local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,unsigned_long>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)__return_storage_ptr__,
               local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
               super__Vector_impl_data._M_start,&local_48);
  }
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<std::string, uint64_t> DatabaseConfig::get_all() const {
    std::unordered_map<std::string, uint64_t> result;
    for (const auto &key : ConfigKey::available()) {
        result.emplace(key.key(), get(key));
    }
    return result;
}